

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::operationToName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Operation *operations,
          bool useBranch)

{
  bool bVar1;
  ostringstream stream;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  bVar1 = ((byte)*this & 4) == 0;
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"get",3);
  }
  if (((byte)*this & 1) != 0) {
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"inc",3);
    bVar1 = false;
  }
  if (((byte)*this & 2) != 0) {
    if (!bVar1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"dec",3);
  }
  if ((char)operations != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_branch",7);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string operationToName (const AtomicCounterTest::Operation& operations, bool useBranch)
{
	std::ostringstream	stream;
	bool				first = true;

	if ((operations & AtomicCounterTest::OPERATION_GET) != 0)
	{
		stream << "get";
		first = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_INC) != 0)
	{
		if (!first)
			stream << "_";

		stream << "inc";
		first = false;
	}

	if ((operations & AtomicCounterTest::OPERATION_DEC) != 0)
	{
		if (!first)
			stream << "_";

		stream << "dec";
		first = false;
	}

	if (useBranch)
		stream << "_branch";

	return stream.str();
}